

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::InternalSwap
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *other)

{
  RandomNormalStaticLayerParams *other_local;
  RandomNormalStaticLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  google::protobuf::internal::memswap<16>((char *)&this->seed_,(char *)&other->seed_);
  return;
}

Assistant:

void RandomNormalStaticLayerParams::InternalSwap(RandomNormalStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  outputshape_.InternalSwap(&other->outputshape_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(RandomNormalStaticLayerParams, stddev_)
      + sizeof(RandomNormalStaticLayerParams::stddev_)
      - PROTOBUF_FIELD_OFFSET(RandomNormalStaticLayerParams, seed_)>(
          reinterpret_cast<char*>(&seed_),
          reinterpret_cast<char*>(&other->seed_));
}